

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddExport.c
# Opt level: O2

int Cudd_DumpDaVinci(DdManager *dd,int n,DdNode **f,char **inames,char **onames,FILE *fp)

{
  DdNode *pDVar1;
  int iVar2;
  FILE *fp_00;
  st__generator *gen;
  uint uVar3;
  char *pcVar4;
  DdNode **ppDVar5;
  FILE *mask;
  DdNode **key_p;
  ulong uVar6;
  ulong uVar7;
  DdNode *scan;
  
  mask = fp;
  fp_00 = (FILE *)st__init_table(st__ptrcmp,st__ptrhash);
  if (fp_00 == (FILE *)0x0) {
    return 0;
  }
  uVar7 = 0;
  uVar6 = 0;
  if (0 < n) {
    uVar6 = (ulong)(uint)n;
  }
  while (uVar6 != uVar7) {
    iVar2 = cuddCollectNodes((DdNode *)((ulong)f[uVar7] & 0xfffffffffffffffe),(st__table *)fp_00);
    uVar7 = uVar7 + 1;
    if (iVar2 == 0) goto LAB_00749f44;
  }
  pDVar1 = *f;
  gen = st__init_gen((st__table *)fp_00);
  ppDVar5 = (DdNode **)0x0;
  key_p = &scan;
  while (iVar2 = st__gen(gen,(char **)key_p,(char **)0x0), iVar2 != 0) {
    ppDVar5 = (DdNode **)((ulong)ppDVar5 | (ulong)scan ^ (ulong)pDVar1 & 0xfffffffffffffffe);
  }
  st__free_gen(gen);
  uVar3 = 0;
  do {
    if (0x3f < uVar3) break;
    key_p = (DdNode **)(ulong)(uint)~(-1 << ((byte)uVar3 & 0x1f));
    uVar3 = uVar3 + 4;
  } while (key_p < ppDVar5);
  st__free_table((st__table *)fp_00);
  fp_00 = (FILE *)st__init_table(st__ptrcmp,st__ptrhash);
  if (fp_00 == (FILE *)0x0) {
    return 0;
  }
  uVar3 = 0;
  iVar2 = fprintf((FILE *)fp,"[");
  if (iVar2 != -1) {
    uVar7 = 0;
    while (uVar6 != uVar7) {
      if (onames == (char **)0x0) {
        iVar2 = fprintf((FILE *)fp,"l(\"f%d\",n(\"root\",[a(\"OBJECT\",\"f%d\")],",
                        uVar7 & 0xffffffff,uVar7 & 0xffffffff);
      }
      else {
        iVar2 = fprintf((FILE *)fp,"l(\"%s\",n(\"root\",[a(\"OBJECT\",\"%s\")],",onames[uVar7]);
      }
      if (iVar2 == -1) goto LAB_00749f44;
      pcVar4 = "red";
      if (((ulong)f[uVar7] & 1) == 0) {
        pcVar4 = "blue";
      }
      uVar3 = 0;
      iVar2 = fprintf((FILE *)fp,"[e(\"edge\",[a(\"EDGECOLOR\",\"%s\"),a(\"_DIR\",\"none\")],",
                      pcVar4);
      if ((iVar2 == -1) ||
         (iVar2 = ddDoDumpDaVinci((DdManager *)((ulong)f[uVar7] & 0xfffffffffffffffe),(DdNode *)fp,
                                  fp_00,(st__table *)inames,(char **)key_p,(ptruint)mask),
         iVar2 == 0)) goto LAB_00749f47;
      pcVar4 = ",";
      if (n - 1 == uVar7) {
        pcVar4 = "";
      }
      uVar3 = 0;
      iVar2 = fprintf((FILE *)fp,")]))%s",pcVar4);
      uVar7 = uVar7 + 1;
      if (iVar2 == -1) goto LAB_00749f47;
    }
    iVar2 = fprintf((FILE *)fp,"]\n");
    uVar3 = (uint)(iVar2 != -1);
  }
LAB_00749f47:
  st__free_table((st__table *)fp_00);
  return uVar3;
LAB_00749f44:
  uVar3 = 0;
  goto LAB_00749f47;
}

Assistant:

int
Cudd_DumpDaVinci(
  DdManager * dd /* manager */,
  int  n /* number of output nodes to be dumped */,
  DdNode ** f /* array of output nodes to be dumped */,
  char ** inames /* array of input names (or NULL) */,
  char ** onames /* array of output names (or NULL) */,
  FILE * fp /* pointer to the dump file */)
{
    DdNode        *support = NULL;
    DdNode        *scan;
    st__table      *visited = NULL;
    int           retval;
    int           i;
    st__generator  *gen;
    ptruint       refAddr, diff, mask;

    /* Initialize symbol table for visited nodes. */
    visited = st__init_table( st__ptrcmp, st__ptrhash);
    if (visited == NULL) goto failure;

    /* Collect all the nodes of this DD in the symbol table. */
    for (i = 0; i < n; i++) {
        retval = cuddCollectNodes(Cudd_Regular(f[i]),visited);
        if (retval == 0) goto failure;
    }

    /* Find how many most significant hex digits are identical
    ** in the addresses of all the nodes. Build a mask based
    ** on this knowledge, so that digits that carry no information
    ** will not be printed. This is done in two steps.
    **  1. We scan the symbol table to find the bits that differ
    **     in at least 2 addresses.
    **  2. We choose one of the possible masks. There are 8 possible
    **     masks for 32-bit integer, and 16 possible masks for 64-bit
    **     integers.
    */

    /* Find the bits that are different. */
    refAddr = (ptruint) Cudd_Regular(f[0]);
    diff = 0;
    gen = st__init_gen(visited);
    while ( st__gen(gen, (const char **)&scan, NULL)) {
        diff |= refAddr ^ (ptruint) scan;
    }
    st__free_gen(gen);

    /* Choose the mask. */
    for (i = 0; (unsigned) i < 8 * sizeof(ptruint); i += 4) {
        mask = (1 << i) - 1;
        if (diff <= mask) break;
    }
    st__free_table(visited);

    /* Initialize symbol table for visited nodes. */
    visited = st__init_table( st__ptrcmp, st__ptrhash);
    if (visited == NULL) goto failure;

    retval = fprintf(fp, "[");
    if (retval == EOF) goto failure;
    /* Call the function that really gets the job done. */
    for (i = 0; i < n; i++) {
        if (onames == NULL) {
            retval = fprintf(fp,
                             "l(\"f%d\",n(\"root\",[a(\"OBJECT\",\"f%d\")],",
                             i,i);
        } else {
            retval = fprintf(fp,
                             "l(\"%s\",n(\"root\",[a(\"OBJECT\",\"%s\")],",
                             onames[i], onames[i]);
        }
        if (retval == EOF) goto failure;
        retval = fprintf(fp, "[e(\"edge\",[a(\"EDGECOLOR\",\"%s\"),a(\"_DIR\",\"none\")],",
                         Cudd_IsComplement(f[i]) ? "red" : "blue");
        if (retval == EOF) goto failure;
        retval = ddDoDumpDaVinci(dd,Cudd_Regular(f[i]),fp,visited,inames,mask);
        if (retval == 0) goto failure;
        retval = fprintf(fp, ")]))%s", i == n-1 ? "" : ",");
        if (retval == EOF) goto failure;
    }

    /* Write trailer and return. */
    retval = fprintf(fp, "]\n");
    if (retval == EOF) goto failure;

    st__free_table(visited);
    return(1);

failure:
    if (support != NULL) Cudd_RecursiveDeref(dd,support);
    if (visited != NULL) st__free_table(visited);
    return(0);

}